

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int test_bins(void)

{
  int iVar1;
  uint32_t uVar2;
  ulong __n;
  char *pcVar3;
  uint local_39c;
  uint32_t i_12;
  char *d;
  long lStack_388;
  char head [5];
  ptrdiff_t rl;
  ptrdiff_t hl;
  ptrdiff_t sz;
  char *local_368;
  char *d4_11;
  char *d3_11;
  char *s2_11;
  char *pcStack_348;
  uint32_t len2_11;
  char *d2_11;
  char *d1_11;
  char *pcStack_330;
  uint32_t i_11;
  char *s1_11;
  char *local_320;
  char *d4_10;
  char *d3_10;
  char *s2_10;
  char *pcStack_300;
  uint32_t len2_10;
  char *d2_10;
  char *d1_10;
  char *pcStack_2e8;
  uint32_t i_10;
  char *s1_10;
  char *local_2d8;
  char *d4_9;
  char *d3_9;
  char *s2_9;
  char *pcStack_2b8;
  uint32_t len2_9;
  char *d2_9;
  char *d1_9;
  char *pcStack_2a0;
  uint32_t i_9;
  char *s1_9;
  char *local_290;
  char *d4_8;
  char *d3_8;
  char *s2_8;
  char *pcStack_270;
  uint32_t len2_8;
  char *d2_8;
  char *d1_8;
  char *pcStack_258;
  uint32_t i_8;
  char *s1_8;
  char *local_248;
  char *d4_7;
  char *d3_7;
  char *s2_7;
  char *pcStack_228;
  uint32_t len2_7;
  char *d2_7;
  char *d1_7;
  char *pcStack_210;
  uint32_t i_7;
  char *s1_7;
  char *local_200;
  char *d4_6;
  char *d3_6;
  char *s2_6;
  char *pcStack_1e0;
  uint32_t len2_6;
  char *d2_6;
  char *d1_6;
  char *pcStack_1c8;
  uint32_t i_6;
  char *s1_6;
  char *local_1b8;
  char *d4_5;
  char *d3_5;
  char *s2_5;
  char *pcStack_198;
  uint32_t len2_5;
  char *d2_5;
  char *d1_5;
  char *pcStack_180;
  uint32_t i_5;
  char *s1_5;
  char *local_170;
  char *d4_4;
  char *d3_4;
  char *s2_4;
  char *pcStack_150;
  uint32_t len2_4;
  char *d2_4;
  char *d1_4;
  char *pcStack_138;
  uint32_t i_4;
  char *s1_4;
  char *local_128;
  char *d4_3;
  char *d3_3;
  char *s2_3;
  char *pcStack_108;
  uint32_t len2_3;
  char *d2_3;
  char *d1_3;
  char *pcStack_f0;
  uint32_t i_3;
  char *s1_3;
  char *local_e0;
  char *d4_2;
  char *d3_2;
  char *s2_2;
  char *pcStack_c0;
  uint32_t len2_2;
  char *d2_2;
  char *d1_2;
  char *pcStack_a8;
  uint32_t i_2;
  char *s1_2;
  char *local_98;
  char *d4_1;
  char *d3_1;
  char *s2_1;
  char *pcStack_78;
  uint32_t len2_1;
  char *d2_1;
  char *d1_1;
  char *pcStack_60;
  uint32_t i_1;
  char *s1_1;
  char *local_50;
  char *d4;
  char *d3;
  char *s2;
  char *pcStack_30;
  uint32_t len2;
  char *d2;
  char *d1;
  char *pcStack_18;
  uint32_t i;
  char *s1;
  
  _plan(0x6b,true);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","test_bins");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"bin len=0x01");
  s1._4_4_ = fprintf(_stdout,"\n");
  pcStack_18 = str;
  d1._4_4_ = 0;
  while (d1._4_4_ == 0) {
    str[0] = 'a';
    d1._4_4_ = 1;
  }
  d2 = mp_encode_bin(data,str,1);
  pcStack_30 = data;
  d3 = mp_decode_bin(&stack0xffffffffffffffd0,(uint32_t *)((long)&s2 + 4));
  _ok((uint)(s2._4_4_ == 1),"0x01 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x239,
      "len(mp_decode_bin(x, %u))",1);
  pcStack_30 = data;
  mp_decode_strbin(&stack0xffffffffffffffd0,(uint32_t *)((long)&s2 + 4));
  _ok((uint)(s2._4_4_ == 1),"0x01 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x239,
      "len(mp_decode_strbin(x, %u))",1);
  d4 = data;
  mp_next(&d4);
  local_50 = data;
  iVar1 = mp_check(&local_50,d4 + 1);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x01)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x239,
      "mp_check_bin(mp_encode_bin(x, 0x01))");
  _ok((uint)(d2 == pcStack_30),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x239,
      "len(mp_decode_bin(x, 0x01)");
  _ok((uint)(d2 == d4),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x239,
      "len(mp_next_bin(x, 0x01)");
  _ok((uint)(d2 == local_50),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x239,
      "len(mp_check_bin(x, 0x01)");
  uVar2 = mp_sizeof_bin(1);
  _ok((uint)(uVar2 == (int)d2 - (int)data),"mp_sizeof_bin(0x01) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x239,
      "mp_sizeof_bin(0x01)");
  iVar1 = memcmp(pcStack_18,d3,1);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0x01) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x239,
      "mp_encode_bin(x, 0x01) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"bin len=0x1e");
  s1_1._4_4_ = fprintf(_stdout,"\n");
  pcStack_60 = str;
  for (d1_1._4_4_ = 0; d1_1._4_4_ < 0x1e; d1_1._4_4_ = d1_1._4_4_ + 1) {
    str[d1_1._4_4_] = (char)((ulong)d1_1._4_4_ % 0x1a) + 'a';
  }
  d2_1 = mp_encode_bin(data,str,0x1e);
  pcStack_78 = data;
  d3_1 = mp_decode_bin(&stack0xffffffffffffff88,(uint32_t *)((long)&s2_1 + 4));
  _ok((uint)(s2_1._4_4_ == 0x1e),"0x1e == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23a,
      "len(mp_decode_bin(x, %u))",0x1e);
  pcStack_78 = data;
  mp_decode_strbin(&stack0xffffffffffffff88,(uint32_t *)((long)&s2_1 + 4));
  _ok((uint)(s2_1._4_4_ == 0x1e),"0x1e == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23a,
      "len(mp_decode_strbin(x, %u))",0x1e);
  d4_1 = data;
  mp_next(&d4_1);
  local_98 = data;
  iVar1 = mp_check(&local_98,d4_1 + 0x1e);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x1e)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23a,
      "mp_check_bin(mp_encode_bin(x, 0x1e))");
  _ok((uint)(d2_1 == pcStack_78),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23a,
      "len(mp_decode_bin(x, 0x1e)");
  _ok((uint)(d2_1 == d4_1),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23a,
      "len(mp_next_bin(x, 0x1e)");
  _ok((uint)(d2_1 == local_98),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23a,
      "len(mp_check_bin(x, 0x1e)");
  uVar2 = mp_sizeof_bin(0x1e);
  _ok((uint)(uVar2 == (int)d2_1 - (int)data),"mp_sizeof_bin(0x1e) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23a,
      "mp_sizeof_bin(0x1e)");
  iVar1 = memcmp(pcStack_60,d3_1,0x1e);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0x1e) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23a,
      "mp_encode_bin(x, 0x1e) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"bin len=0x1f");
  s1_2._4_4_ = fprintf(_stdout,"\n");
  pcStack_a8 = str;
  for (d1_2._4_4_ = 0; d1_2._4_4_ < 0x1f; d1_2._4_4_ = d1_2._4_4_ + 1) {
    str[d1_2._4_4_] = (char)((ulong)d1_2._4_4_ % 0x1a) + 'a';
  }
  d2_2 = mp_encode_bin(data,str,0x1f);
  pcStack_c0 = data;
  d3_2 = mp_decode_bin(&stack0xffffffffffffff40,(uint32_t *)((long)&s2_2 + 4));
  _ok((uint)(s2_2._4_4_ == 0x1f),"0x1f == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23b,
      "len(mp_decode_bin(x, %u))",0x1f);
  pcStack_c0 = data;
  mp_decode_strbin(&stack0xffffffffffffff40,(uint32_t *)((long)&s2_2 + 4));
  _ok((uint)(s2_2._4_4_ == 0x1f),"0x1f == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23b,
      "len(mp_decode_strbin(x, %u))",0x1f);
  d4_2 = data;
  mp_next(&d4_2);
  local_e0 = data;
  iVar1 = mp_check(&local_e0,d4_2 + 0x1f);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x1f)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23b,
      "mp_check_bin(mp_encode_bin(x, 0x1f))");
  _ok((uint)(d2_2 == pcStack_c0),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23b,
      "len(mp_decode_bin(x, 0x1f)");
  _ok((uint)(d2_2 == d4_2),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23b,
      "len(mp_next_bin(x, 0x1f)");
  _ok((uint)(d2_2 == local_e0),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23b,
      "len(mp_check_bin(x, 0x1f)");
  uVar2 = mp_sizeof_bin(0x1f);
  _ok((uint)(uVar2 == (int)d2_2 - (int)data),"mp_sizeof_bin(0x1f) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23b,
      "mp_sizeof_bin(0x1f)");
  iVar1 = memcmp(pcStack_a8,d3_2,0x1f);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0x1f) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23b,
      "mp_encode_bin(x, 0x1f) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"bin len=0x20");
  s1_3._4_4_ = fprintf(_stdout,"\n");
  pcStack_f0 = str;
  for (d1_3._4_4_ = 0; d1_3._4_4_ < 0x20; d1_3._4_4_ = d1_3._4_4_ + 1) {
    str[d1_3._4_4_] = (char)((ulong)d1_3._4_4_ % 0x1a) + 'a';
  }
  d2_3 = mp_encode_bin(data,str,0x20);
  pcStack_108 = data;
  d3_3 = mp_decode_bin(&stack0xfffffffffffffef8,(uint32_t *)((long)&s2_3 + 4));
  _ok((uint)(s2_3._4_4_ == 0x20),"0x20 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23c,
      "len(mp_decode_bin(x, %u))",0x20);
  pcStack_108 = data;
  mp_decode_strbin(&stack0xfffffffffffffef8,(uint32_t *)((long)&s2_3 + 4));
  _ok((uint)(s2_3._4_4_ == 0x20),"0x20 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23c,
      "len(mp_decode_strbin(x, %u))",0x20);
  d4_3 = data;
  mp_next(&d4_3);
  local_128 = data;
  iVar1 = mp_check(&local_128,d4_3 + 0x20);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x20)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23c,
      "mp_check_bin(mp_encode_bin(x, 0x20))");
  _ok((uint)(d2_3 == pcStack_108),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23c,
      "len(mp_decode_bin(x, 0x20)");
  _ok((uint)(d2_3 == d4_3),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23c,
      "len(mp_next_bin(x, 0x20)");
  _ok((uint)(d2_3 == local_128),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23c,
      "len(mp_check_bin(x, 0x20)");
  uVar2 = mp_sizeof_bin(0x20);
  _ok((uint)(uVar2 == (int)d2_3 - (int)data),"mp_sizeof_bin(0x20) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23c,
      "mp_sizeof_bin(0x20)");
  iVar1 = memcmp(pcStack_f0,d3_3,0x20);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0x20) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23c,
      "mp_encode_bin(x, 0x20) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"bin len=0xfe");
  s1_4._4_4_ = fprintf(_stdout,"\n");
  pcStack_138 = str;
  for (d1_4._4_4_ = 0; d1_4._4_4_ < 0xfe; d1_4._4_4_ = d1_4._4_4_ + 1) {
    str[d1_4._4_4_] = (char)((ulong)d1_4._4_4_ % 0x1a) + 'a';
  }
  d2_4 = mp_encode_bin(data,str,0xfe);
  pcStack_150 = data;
  d3_4 = mp_decode_bin(&stack0xfffffffffffffeb0,(uint32_t *)((long)&s2_4 + 4));
  _ok((uint)(s2_4._4_4_ == 0xfe),"0xfe == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23d,
      "len(mp_decode_bin(x, %u))",0xfe);
  pcStack_150 = data;
  mp_decode_strbin(&stack0xfffffffffffffeb0,(uint32_t *)((long)&s2_4 + 4));
  _ok((uint)(s2_4._4_4_ == 0xfe),"0xfe == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23d,
      "len(mp_decode_strbin(x, %u))",0xfe);
  d4_4 = data;
  mp_next(&d4_4);
  local_170 = data;
  iVar1 = mp_check(&local_170,d4_4 + 0xfe);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0xfe)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23d,
      "mp_check_bin(mp_encode_bin(x, 0xfe))");
  _ok((uint)(d2_4 == pcStack_150),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23d,
      "len(mp_decode_bin(x, 0xfe)");
  _ok((uint)(d2_4 == d4_4),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23d,
      "len(mp_next_bin(x, 0xfe)");
  _ok((uint)(d2_4 == local_170),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23d,
      "len(mp_check_bin(x, 0xfe)");
  uVar2 = mp_sizeof_bin(0xfe);
  _ok((uint)(uVar2 == (int)d2_4 - (int)data),"mp_sizeof_bin(0xfe) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23d,
      "mp_sizeof_bin(0xfe)");
  iVar1 = memcmp(pcStack_138,d3_4,0xfe);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0xfe) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23d,
      "mp_encode_bin(x, 0xfe) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"bin len=0xff");
  s1_5._4_4_ = fprintf(_stdout,"\n");
  pcStack_180 = str;
  for (d1_5._4_4_ = 0; d1_5._4_4_ < 0xff; d1_5._4_4_ = d1_5._4_4_ + 1) {
    str[d1_5._4_4_] = (char)((ulong)d1_5._4_4_ % 0x1a) + 'a';
  }
  d2_5 = mp_encode_bin(data,str,0xff);
  pcStack_198 = data;
  d3_5 = mp_decode_bin(&stack0xfffffffffffffe68,(uint32_t *)((long)&s2_5 + 4));
  _ok((uint)(s2_5._4_4_ == 0xff),"0xff == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23e,
      "len(mp_decode_bin(x, %u))",0xff);
  pcStack_198 = data;
  mp_decode_strbin(&stack0xfffffffffffffe68,(uint32_t *)((long)&s2_5 + 4));
  _ok((uint)(s2_5._4_4_ == 0xff),"0xff == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23e,
      "len(mp_decode_strbin(x, %u))",0xff);
  d4_5 = data;
  mp_next(&d4_5);
  local_1b8 = data;
  iVar1 = mp_check(&local_1b8,d4_5 + 0xff);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0xff)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23e,
      "mp_check_bin(mp_encode_bin(x, 0xff))");
  _ok((uint)(d2_5 == pcStack_198),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23e,
      "len(mp_decode_bin(x, 0xff)");
  _ok((uint)(d2_5 == d4_5),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23e,
      "len(mp_next_bin(x, 0xff)");
  _ok((uint)(d2_5 == local_1b8),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23e,
      "len(mp_check_bin(x, 0xff)");
  uVar2 = mp_sizeof_bin(0xff);
  _ok((uint)(uVar2 == (int)d2_5 - (int)data),"mp_sizeof_bin(0xff) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23e,
      "mp_sizeof_bin(0xff)");
  iVar1 = memcmp(pcStack_180,d3_5,0xff);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0xff) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23e,
      "mp_encode_bin(x, 0xff) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"bin len=0x100");
  s1_6._4_4_ = fprintf(_stdout,"\n");
  pcStack_1c8 = str;
  for (d1_6._4_4_ = 0; d1_6._4_4_ < 0x100; d1_6._4_4_ = d1_6._4_4_ + 1) {
    str[d1_6._4_4_] = (char)((ulong)d1_6._4_4_ % 0x1a) + 'a';
  }
  d2_6 = mp_encode_bin(data,str,0x100);
  pcStack_1e0 = data;
  d3_6 = mp_decode_bin(&stack0xfffffffffffffe20,(uint32_t *)((long)&s2_6 + 4));
  _ok((uint)(s2_6._4_4_ == 0x100),"0x100 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23f,
      "len(mp_decode_bin(x, %u))",0x100);
  pcStack_1e0 = data;
  mp_decode_strbin(&stack0xfffffffffffffe20,(uint32_t *)((long)&s2_6 + 4));
  _ok((uint)(s2_6._4_4_ == 0x100),"0x100 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23f,
      "len(mp_decode_strbin(x, %u))",0x100);
  d4_6 = data;
  mp_next(&d4_6);
  local_200 = data;
  iVar1 = mp_check(&local_200,d4_6 + 0x100);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x100)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23f,
      "mp_check_bin(mp_encode_bin(x, 0x100))");
  _ok((uint)(d2_6 == pcStack_1e0),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23f,
      "len(mp_decode_bin(x, 0x100)");
  _ok((uint)(d2_6 == d4_6),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23f,
      "len(mp_next_bin(x, 0x100)");
  _ok((uint)(d2_6 == local_200),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23f,
      "len(mp_check_bin(x, 0x100)");
  uVar2 = mp_sizeof_bin(0x100);
  _ok((uint)(uVar2 == (int)d2_6 - (int)data),"mp_sizeof_bin(0x100) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23f,
      "mp_sizeof_bin(0x100)");
  iVar1 = memcmp(pcStack_1c8,d3_6,0x100);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0x100) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23f,
      "mp_encode_bin(x, 0x100) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"bin len=0x101");
  s1_7._4_4_ = fprintf(_stdout,"\n");
  pcStack_210 = str;
  for (d1_7._4_4_ = 0; d1_7._4_4_ < 0x101; d1_7._4_4_ = d1_7._4_4_ + 1) {
    str[d1_7._4_4_] = (char)((ulong)d1_7._4_4_ % 0x1a) + 'a';
  }
  d2_7 = mp_encode_bin(data,str,0x101);
  pcStack_228 = data;
  d3_7 = mp_decode_bin(&stack0xfffffffffffffdd8,(uint32_t *)((long)&s2_7 + 4));
  _ok((uint)(s2_7._4_4_ == 0x101),"0x101 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x240,
      "len(mp_decode_bin(x, %u))",0x101);
  pcStack_228 = data;
  mp_decode_strbin(&stack0xfffffffffffffdd8,(uint32_t *)((long)&s2_7 + 4));
  _ok((uint)(s2_7._4_4_ == 0x101),"0x101 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x240,
      "len(mp_decode_strbin(x, %u))",0x101);
  d4_7 = data;
  mp_next(&d4_7);
  local_248 = data;
  iVar1 = mp_check(&local_248,d4_7 + 0x101);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x101)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x240,
      "mp_check_bin(mp_encode_bin(x, 0x101))");
  _ok((uint)(d2_7 == pcStack_228),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x240,
      "len(mp_decode_bin(x, 0x101)");
  _ok((uint)(d2_7 == d4_7),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x240,
      "len(mp_next_bin(x, 0x101)");
  _ok((uint)(d2_7 == local_248),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x240,
      "len(mp_check_bin(x, 0x101)");
  uVar2 = mp_sizeof_bin(0x101);
  _ok((uint)(uVar2 == (int)d2_7 - (int)data),"mp_sizeof_bin(0x101) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x240,
      "mp_sizeof_bin(0x101)");
  iVar1 = memcmp(pcStack_210,d3_7,0x101);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0x101) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x240,
      "mp_encode_bin(x, 0x101) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"bin len=0xfffe");
  s1_8._4_4_ = fprintf(_stdout,"\n");
  pcStack_258 = str;
  for (d1_8._4_4_ = 0; d1_8._4_4_ < 0xfffe; d1_8._4_4_ = d1_8._4_4_ + 1) {
    str[d1_8._4_4_] = (char)((ulong)d1_8._4_4_ % 0x1a) + 'a';
  }
  d2_8 = mp_encode_bin(data,str,0xfffe);
  pcStack_270 = data;
  d3_8 = mp_decode_bin(&stack0xfffffffffffffd90,(uint32_t *)((long)&s2_8 + 4));
  _ok((uint)(s2_8._4_4_ == 0xfffe),"0xfffe == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x241,
      "len(mp_decode_bin(x, %u))",0xfffe);
  pcStack_270 = data;
  mp_decode_strbin(&stack0xfffffffffffffd90,(uint32_t *)((long)&s2_8 + 4));
  _ok((uint)(s2_8._4_4_ == 0xfffe),"0xfffe == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x241,
      "len(mp_decode_strbin(x, %u))",0xfffe);
  d4_8 = data;
  mp_next(&d4_8);
  local_290 = data;
  iVar1 = mp_check(&local_290,d4_8 + 0xfffe);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0xfffe)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x241,
      "mp_check_bin(mp_encode_bin(x, 0xfffe))");
  _ok((uint)(d2_8 == pcStack_270),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x241,
      "len(mp_decode_bin(x, 0xfffe)");
  _ok((uint)(d2_8 == d4_8),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x241,
      "len(mp_next_bin(x, 0xfffe)");
  _ok((uint)(d2_8 == local_290),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x241,
      "len(mp_check_bin(x, 0xfffe)");
  uVar2 = mp_sizeof_bin(0xfffe);
  _ok((uint)(uVar2 == (int)d2_8 - (int)data),"mp_sizeof_bin(0xfffe) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x241,
      "mp_sizeof_bin(0xfffe)");
  iVar1 = memcmp(pcStack_258,d3_8,0xfffe);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0xfffe) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x241,
      "mp_encode_bin(x, 0xfffe) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"bin len=0xffff");
  s1_9._4_4_ = fprintf(_stdout,"\n");
  pcStack_2a0 = str;
  for (d1_9._4_4_ = 0; d1_9._4_4_ < 0xffff; d1_9._4_4_ = d1_9._4_4_ + 1) {
    str[d1_9._4_4_] = (char)((ulong)d1_9._4_4_ % 0x1a) + 'a';
  }
  d2_9 = mp_encode_bin(data,str,0xffff);
  pcStack_2b8 = data;
  d3_9 = mp_decode_bin(&stack0xfffffffffffffd48,(uint32_t *)((long)&s2_9 + 4));
  _ok((uint)(s2_9._4_4_ == 0xffff),"0xffff == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x242,
      "len(mp_decode_bin(x, %u))",0xffff);
  pcStack_2b8 = data;
  mp_decode_strbin(&stack0xfffffffffffffd48,(uint32_t *)((long)&s2_9 + 4));
  _ok((uint)(s2_9._4_4_ == 0xffff),"0xffff == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x242,
      "len(mp_decode_strbin(x, %u))",0xffff);
  d4_9 = data;
  mp_next(&d4_9);
  local_2d8 = data;
  iVar1 = mp_check(&local_2d8,d4_9 + 0xffff);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0xffff)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x242,
      "mp_check_bin(mp_encode_bin(x, 0xffff))");
  _ok((uint)(d2_9 == pcStack_2b8),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x242,
      "len(mp_decode_bin(x, 0xffff)");
  _ok((uint)(d2_9 == d4_9),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x242,
      "len(mp_next_bin(x, 0xffff)");
  _ok((uint)(d2_9 == local_2d8),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x242,
      "len(mp_check_bin(x, 0xffff)");
  uVar2 = mp_sizeof_bin(0xffff);
  _ok((uint)(uVar2 == (int)d2_9 - (int)data),"mp_sizeof_bin(0xffff) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x242,
      "mp_sizeof_bin(0xffff)");
  iVar1 = memcmp(pcStack_2a0,d3_9,0xffff);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0xffff) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x242,
      "mp_encode_bin(x, 0xffff) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"bin len=0x10000");
  s1_10._4_4_ = fprintf(_stdout,"\n");
  pcStack_2e8 = str;
  for (d1_10._4_4_ = 0; d1_10._4_4_ < 0x10000; d1_10._4_4_ = d1_10._4_4_ + 1) {
    str[d1_10._4_4_] = (char)((ulong)d1_10._4_4_ % 0x1a) + 'a';
  }
  d2_10 = mp_encode_bin(data,str,0x10000);
  pcStack_300 = data;
  d3_10 = mp_decode_bin(&stack0xfffffffffffffd00,(uint32_t *)((long)&s2_10 + 4));
  _ok((uint)(s2_10._4_4_ == 0x10000),"0x10000 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x243,
      "len(mp_decode_bin(x, %u))",0x10000);
  pcStack_300 = data;
  mp_decode_strbin(&stack0xfffffffffffffd00,(uint32_t *)((long)&s2_10 + 4));
  _ok((uint)(s2_10._4_4_ == 0x10000),"0x10000 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x243,
      "len(mp_decode_strbin(x, %u))",0x10000);
  d4_10 = data;
  mp_next(&d4_10);
  local_320 = data;
  iVar1 = mp_check(&local_320,d4_10 + 0x10000);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x10000)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x243,
      "mp_check_bin(mp_encode_bin(x, 0x10000))");
  _ok((uint)(d2_10 == pcStack_300),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x243,
      "len(mp_decode_bin(x, 0x10000)");
  _ok((uint)(d2_10 == d4_10),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x243,
      "len(mp_next_bin(x, 0x10000)");
  _ok((uint)(d2_10 == local_320),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x243,
      "len(mp_check_bin(x, 0x10000)");
  uVar2 = mp_sizeof_bin(0x10000);
  _ok((uint)(uVar2 == (int)d2_10 - (int)data),"mp_sizeof_bin(0x10000) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x243,
      "mp_sizeof_bin(0x10000)");
  iVar1 = memcmp(pcStack_2e8,d3_10,0x10000);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0x10000) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x243,
      "mp_encode_bin(x, 0x10000) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"bin len=0x10001");
  s1_11._4_4_ = fprintf(_stdout,"\n");
  pcStack_330 = str;
  for (d1_11._4_4_ = 0; d1_11._4_4_ < 0x10001; d1_11._4_4_ = d1_11._4_4_ + 1) {
    str[d1_11._4_4_] = (char)((ulong)d1_11._4_4_ % 0x1a) + 'a';
  }
  d2_11 = mp_encode_bin(data,str,0x10001);
  pcStack_348 = data;
  d3_11 = mp_decode_bin(&stack0xfffffffffffffcb8,(uint32_t *)((long)&s2_11 + 4));
  _ok((uint)(s2_11._4_4_ == 0x10001),"0x10001 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x244,
      "len(mp_decode_bin(x, %u))",0x10001);
  pcStack_348 = data;
  mp_decode_strbin(&stack0xfffffffffffffcb8,(uint32_t *)((long)&s2_11 + 4));
  _ok((uint)(s2_11._4_4_ == 0x10001),"0x10001 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x244,
      "len(mp_decode_strbin(x, %u))",0x10001);
  d4_11 = data;
  mp_next(&d4_11);
  local_368 = data;
  iVar1 = mp_check(&local_368,d4_11 + 0x10001);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 0x10001)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x244,
      "mp_check_bin(mp_encode_bin(x, 0x10001))");
  _ok((uint)(d2_11 == pcStack_348),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x244,
      "len(mp_decode_bin(x, 0x10001)");
  _ok((uint)(d2_11 == d4_11),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x244,
      "len(mp_next_bin(x, 0x10001)");
  _ok((uint)(d2_11 == local_368),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x244,
      "len(mp_check_bin(x, 0x10001)");
  uVar2 = mp_sizeof_bin(0x10001);
  _ok((uint)(uVar2 == (int)d2_11 - (int)data),"mp_sizeof_bin(0x10001) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x244,
      "mp_sizeof_bin(0x10001)");
  iVar1 = memcmp(pcStack_330,d3_11,0x10001);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0x10001) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x244,
      "mp_encode_bin(x, 0x10001) == x");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"bin_safe");
  sz._4_4_ = fprintf(_stdout,"\n");
  uVar2 = mp_sizeof_binl(0x10001);
  __n = (ulong)uVar2;
  lStack_388 = __n + 0x10001;
  for (local_39c = 0; local_39c < 0x10001; local_39c = local_39c + 1) {
    str[local_39c] = (char)((ulong)local_39c % 0x1a) + 'a';
  }
  mp_encode_binl((char *)((long)&d + 3),0x10001);
  hl = 0;
  pcVar3 = mp_encode_bin_safe((char *)0x0,&hl,str,0x10001);
  _ok((uint)(-hl == lStack_388),"-sz == rl",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x246,
      "size after mp_encode_bin_safe(NULL, &sz)");
  _ok((uint)(pcVar3 == (char *)0x0),"d == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x246,
      "mp_encode_bin_safe(NULL, &sz)");
  hl = lStack_388;
  pcVar3 = mp_encode_bin_safe(data,&hl,str,0x10001);
  _ok((uint)(hl == 0),"sz == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x246,
      "size after mp_encode_bin_safe(buf, &sz)");
  _ok((uint)((long)pcVar3 - (long)data == lStack_388),"(d - data) == rl",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x246,
      "len of mp_encode_bin_safe(buf, &sz)");
  iVar1 = memcmp(data,(void *)((long)&d + 3),__n);
  _ok((uint)(iVar1 == 0),"memcmp(data, head, hl) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x246,
      "head of mp_encode_bin_safe(buf, &sz)");
  iVar1 = memcmp(data + __n,str,0x10001);
  _ok((uint)(iVar1 == 0),"memcmp(data + hl, str, (0x10001)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x246,
      "payload of mp_encode_bin_safe(buf, &sz)");
  hl = lStack_388 + -1;
  pcVar3 = mp_encode_bin_safe(data,&hl,str,0x10001);
  _ok((uint)(hl == -1),"sz == -1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x246,
      "size after mp_encode_bin_safe(buf, &sz) overflow");
  _ok((uint)(pcVar3 == data),"d == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x246,
      "mp_encode_bin_safe(buf, &sz) overflow");
  pcVar3 = mp_encode_bin_safe(data,(ptrdiff_t *)0x0,str,0x10001);
  _ok((uint)((long)pcVar3 - (long)data == lStack_388),"(d - data) == rl",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x246,
      "len of mp_encode_bin_safe(buf, NULL)");
  iVar1 = memcmp(data,(void *)((long)&d + 3),__n);
  _ok((uint)(iVar1 == 0),"memcmp(data, head, hl) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x246,
      "head of mp_encode_bin_safe(buf, NULL)");
  iVar1 = memcmp(data + __n,str,0x10001);
  _ok((uint)(iVar1 == 0),"memcmp(data + hl, str, (0x10001)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x246,
      "payload of mp_encode_bin_safe(buf, NULL)");
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","test_bins");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

static int
test_bins(void)
{
	plan(12*8 + 11);
	header();

	test_bin(0x01);
	test_bin(0x1e);
	test_bin(0x1f);
	test_bin(0x20);
	test_bin(0xfe);
	test_bin(0xff);
	test_bin(0x100);
	test_bin(0x101);
	test_bin(0xfffe);
	test_bin(0xffff);
	test_bin(0x10000);
	test_bin(0x10001);

	test_bin_safe(0x10001);

	footer();
	return check_plan();
}